

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void rw::free_managed(void *p)

{
  long lVar1;
  long *plVar2;
  
  if (p != (void *)0x0) {
    lVar1 = *(long *)((long)p + -0x10);
    plVar2 = *(long **)((long)p + -8);
    *plVar2 = lVar1;
    *(long **)(lVar1 + 8) = plVar2;
    totalMemoryAllocated = totalMemoryAllocated - *(long *)((long)p + -0x30);
    free(*(void **)((long)p + -0x20));
    return;
  }
  return;
}

Assistant:

void
free_managed(void *p)
{
	MemoryBlock *mem;
	if(p == nil)
		return;
	mem = (MemoryBlock*)((uint8*)p-sizeof(MemoryBlock));
	mem->inAllocList.remove();
	totalMemoryAllocated -= mem->sz;
	free(mem->origPtr);
}